

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O1

void __thiscall CCNR::ls_solver::update_clause_weights(ls_solver *this)

{
  longlong *plVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  pointer pcVar5;
  pointer pvVar6;
  iterator __position;
  int *piVar7;
  ulong uVar8;
  iterator __begin1;
  iterator __end1;
  int v;
  int local_2c;
  
  piVar7 = (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar7 != piVar4) {
    pcVar5 = (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      plVar1 = &pcVar5[*piVar7].weight;
      *plVar1 = *plVar1 + 1;
      piVar7 = piVar7 + 1;
    } while (piVar7 != piVar4);
  }
  piVar7 = (this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this->_mems = this->_mems + ((long)piVar4 - (long)piVar7 >> 2);
  if (piVar4 != piVar7) {
    do {
      local_2c = *piVar7;
      pvVar6 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar3 = pvVar6[local_2c].unsat_appear;
      plVar1 = &pvVar6[local_2c].score;
      lVar2 = *plVar1;
      *plVar1 = *plVar1 + (long)iVar3;
      if (((*plVar1 != 0 && SCARRY8(lVar2,(long)iVar3) == *plVar1 < 0) &&
          (pvVar6[local_2c].cc_value == true)) && (pvVar6[local_2c].is_in_ccd_vars == false)) {
        __position._M_current =
             (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->_ccd_vars,__position,&local_2c);
        }
        else {
          *__position._M_current = local_2c;
          (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>._M_impl.
        super__Vector_impl_data._M_start[local_2c].is_in_ccd_vars = true;
      }
      piVar7 = piVar7 + 1;
    } while (piVar7 != piVar4);
  }
  uVar8 = ((long)(this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2) + this->_delta_total_clause_weight;
  this->_delta_total_clause_weight = uVar8;
  if (this->_num_clauses <= uVar8) {
    iVar3 = this->_avg_clause_weight;
    this->_avg_clause_weight = iVar3 + 1;
    this->_delta_total_clause_weight = uVar8 - this->_num_clauses;
    if (this->_swt_threshold <= iVar3) {
      smooth_clause_weights(this);
    }
  }
  return;
}

Assistant:

void ls_solver::update_clause_weights()
{
    for (int c : _unsat_clauses) {
        _clauses[c].weight++;
    }
    _mems += _unsat_vars.size();
    for (int v : _unsat_vars) {
        _vars[v].score += _vars[v].unsat_appear;
        if (_vars[v].score > 0 && 1 == _vars[v].cc_value && !(_vars[v].is_in_ccd_vars)) {
            _ccd_vars.push_back(v);
            _vars[v].is_in_ccd_vars = 1;
        }
    }
    _delta_total_clause_weight += _unsat_clauses.size();
    if (_delta_total_clause_weight >= _num_clauses) {
        _avg_clause_weight += 1;
        _delta_total_clause_weight -= _num_clauses;
        if (_avg_clause_weight > _swt_threshold) {
            smooth_clause_weights();
        }
    }
}